

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::checkSampleTemporalStability
          (UploadWaitDrawCase *this,offset_in_Result_to_deUint64 target,char *description)

{
  int iVar1;
  pointer piVar2;
  pointer pRVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  size_type __n;
  float fVar7;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> dataPoints;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_1e0;
  undefined1 local_1c8 [16];
  float local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined1 local_1a0 [8];
  float local_198;
  float fStack_194;
  ios_base local_128 [264];
  
  __n = (long)(this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&local_1e0,__n,(allocator_type *)local_1a0);
  piVar2 = (this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(this->m_iterationOrder).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
  if (0 < (int)uVar5) {
    pRVar3 = (this->m_results).
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      iVar1 = piVar2[uVar6];
      local_1e0.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar1].m_data[0] = (float)(int)uVar6;
      local_1e0.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[iVar1].m_data[1] =
           (float)*(ulong *)((long)&pRVar3[iVar1].uploadDuration + target);
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar6);
  }
  deqp::gls::theilSenSiegelLinearRegression
            ((LineParametersWithConfidence *)local_1a0,&local_1e0,0.6);
  local_1c8 = ZEXT416((uint)fStack_194);
  fVar7 = -fStack_194;
  if (-fStack_194 <= fStack_194) {
    fVar7 = fStack_194;
  }
  fVar7 = (float)(int)__n * fVar7;
  local_1b8 = -(float)local_1a0._0_4_;
  if (-(float)local_1a0._0_4_ <= (float)local_1a0._0_4_) {
    local_1b8 = (float)local_1a0._0_4_;
  }
  local_1b8 = local_1b8 * 0.25;
  uStack_1b4 = 0x80000000;
  uStack_1b0 = 0x80000000;
  uStack_1ac = 0x80000000;
  if (local_1b8 < fVar7) {
    local_1a0 = (undefined1  [8])
                ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    if (description == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_198 +
                      (int)*(undefined8 *)(CONCAT44(fStack_194,local_198) + -0x18));
    }
    else {
      sVar4 = strlen(description);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,description,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,
               ": Correlation with data point observation order and result time. Results are not temporally stable, observations are not independent.\n"
               ,0x86);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"\tCoefficient: ",0xe);
    std::ostream::_M_insert<double>((double)(float)local_1c8._0_4_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198," (us / observation)\n",0x14);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
  }
  if (local_1e0.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return fVar7 <= local_1b8;
}

Assistant:

bool UploadWaitDrawCase::checkSampleTemporalStability (deUint64 (UploadWaitDrawCase::Result::*target), const char* description)
{
	// Try to find correlation with sample order and sample times

	const int						numDataPoints	= (int)m_iterationOrder.size();
	std::vector<tcu::Vec2>			dataPoints		(m_iterationOrder.size());
	LineParametersWithConfidence	lineFit;

	for (int ndx = 0; ndx < (int)m_iterationOrder.size(); ++ndx)
	{
		dataPoints[m_iterationOrder[ndx]].x() = (float)ndx;
		dataPoints[m_iterationOrder[ndx]].y() = (float)(m_results[m_iterationOrder[ndx]].*target);
	}

	lineFit = theilSenSiegelLinearRegression(dataPoints, 0.6f);

	// Difference of more than 25% of the offset along the whole sample range
	if (de::abs(lineFit.coefficient) * (float)numDataPoints > de::abs(lineFit.offset) * 0.25f)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< description << ": Correlation with data point observation order and result time. Results are not temporally stable, observations are not independent.\n"
			<< "\tCoefficient: " << lineFit.coefficient << " (us / observation)\n"
			<< tcu::TestLog::EndMessage;

		return false;
	}
	else
		return true;
}